

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgParticleSwarm.hpp
# Opt level: O2

void __thiscall TasOptimization::ParticleSwarmState::clearCache(ParticleSwarmState *this)

{
  pointer pdVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  _Bvector_impl *p_Var6;
  pointer pdVar7;
  _Bit_iterator __first;
  _Bit_iterator __first_00;
  _Bit_iterator __last;
  _Bit_iterator __last_00;
  bool local_a;
  bool local_9;
  
  this->cache_initialized = false;
  pdVar1 = (this->cache_particle_fvals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar7 = (this->cache_particle_fvals).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start; pdVar7 != pdVar1; pdVar7 = pdVar7 + 1) {
    *pdVar7 = 0.0;
  }
  p_Var6 = &(this->cache_particle_inside).super__Bvector_base<std::allocator<bool>_>._M_impl;
  uVar2 = (p_Var6->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
  uVar3 = (p_Var6->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
  __last.super__Bit_iterator_base._M_offset = uVar3;
  __last.super__Bit_iterator_base._M_p = (_Bit_type *)uVar2;
  local_9 = false;
  __first.super__Bit_iterator_base._8_8_ = 0;
  __first.super__Bit_iterator_base._M_p =
       (this->cache_particle_inside).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  __last.super__Bit_iterator_base._12_4_ = 0;
  std::__fill_a1(__first,__last,&local_9);
  pdVar1 = (this->cache_best_particle_fvals).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pdVar7 = (this->cache_best_particle_fvals).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start; pdVar7 != pdVar1; pdVar7 = pdVar7 + 1) {
    *pdVar7 = 0.0;
  }
  p_Var6 = &(this->cache_best_particle_inside).super__Bvector_base<std::allocator<bool>_>._M_impl;
  uVar4 = (p_Var6->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
  uVar5 = (p_Var6->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
  __last_00.super__Bit_iterator_base._M_offset = uVar5;
  __last_00.super__Bit_iterator_base._M_p = (_Bit_type *)uVar4;
  local_a = false;
  __first_00.super__Bit_iterator_base._8_8_ = 0;
  __first_00.super__Bit_iterator_base._M_p =
       (this->cache_best_particle_inside).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  __last_00.super__Bit_iterator_base._12_4_ = 0;
  std::__fill_a1(__first_00,__last_00,&local_a);
  return;
}

Assistant:

void clearCache() {
        cache_initialized = false;
        std::fill(cache_particle_fvals.begin(), cache_particle_fvals.end(), 0.0);
        std::fill(cache_particle_inside.begin(), cache_particle_inside.end(), false);
        std::fill(cache_best_particle_fvals.begin(), cache_best_particle_fvals.end(), 0.0);
        std::fill(cache_best_particle_inside.begin(), cache_best_particle_inside.end(), false);
    }